

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LateCallDescriptor.cpp
# Opt level: O0

int __thiscall
ninx::parser::util::LateCallDescriptor::clone
          (LateCallDescriptor *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Block *local_18;
  LateCallDescriptor *this_local;
  
  local_18 = (Block *)__fn;
  this_local = this;
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::operator->((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)__fn);
  element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)&stack0xffffffffffffffe0);
  std::
  make_unique<ninx::parser::util::LateCallDescriptor,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>,ninx::parser::element::FunctionDefinition*&,ninx::parser::element::Block*&>
            (&this->body,(FunctionDefinition **)&stack0xffffffffffffffe0,(Block **)(__fn + 8));
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)&stack0xffffffffffffffe0);
  return (int)this;
}

Assistant:

std::unique_ptr<ninx::parser::util::LateCallDescriptor> ninx::parser::util::LateCallDescriptor::clone() {
    return std::make_unique<LateCallDescriptor>(body->clone<ninx::parser::element::Block>(), function, target_object);
}